

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int FindLatestMTMessage(uchar *buf,int buflen,int addr,int mid,uchar **pFoundMsg,
                       int *pFoundMsgTmpLen)

{
  int iVar1;
  int local_44;
  int msglen;
  int len;
  uchar *ptr;
  int *pFoundMsgTmpLen_local;
  uchar **pFoundMsg_local;
  int local_20;
  int mid_local;
  int addr_local;
  int buflen_local;
  uchar *buf_local;
  
  _msglen = (uchar *)0x0;
  local_44 = 0;
  ptr = (uchar *)pFoundMsgTmpLen;
  pFoundMsgTmpLen_local = (int *)pFoundMsg;
  pFoundMsg_local._4_4_ = mid;
  local_20 = addr;
  mid_local = buflen;
  _addr_local = buf;
  iVar1 = FindMTMessage(buf,buflen,addr,mid,(uchar **)&msglen,&local_44);
  if (iVar1 == 0) {
    do {
      *(uchar **)pFoundMsgTmpLen_local = _msglen;
      *(int *)ptr = local_44;
      iVar1 = GetLengthMTMessage(*(uchar **)pFoundMsgTmpLen_local);
      iVar1 = FindMTMessage((uchar *)(*(long *)pFoundMsgTmpLen_local + (long)iVar1),
                            *(int *)ptr - iVar1,local_20,pFoundMsg_local._4_4_,(uchar **)&msglen,
                            &local_44);
    } while (iVar1 == 0);
    buf_local._4_4_ = 0;
  }
  else {
    pFoundMsgTmpLen_local[0] = 0;
    pFoundMsgTmpLen_local[1] = 0;
    ptr[0] = '\0';
    ptr[1] = '\0';
    ptr[2] = '\0';
    ptr[3] = '\0';
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int FindLatestMTMessage(unsigned char* buf, int buflen, int addr, int mid, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	unsigned char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindMTMessage(buf, buflen, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected total message length.
		msglen = GetLengthMTMessage(*pFoundMsg);

		// Search just after the message.
		if (FindMTMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, 
			addr, mid, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}